

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeIntlObject
               (DynamicObject *IntlObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  anon_class_1_0_00000001 intlInitializer;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *IntlObject_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,IntlObject,mode,2,0);
  pJVar1 = RecyclableObject::GetLibrary(&IntlObject->super_RecyclableObject);
  InitializeIntlForPrototypes<Js::JavascriptLibrary::InitializeIntlObject(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)::__0>
            (pJVar1);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeIntlObject(DynamicObject* IntlObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(IntlObject, mode,  /*initSlotCapacity*/ 2);

        auto intlInitializer = [&](IntlEngineInterfaceExtensionObject* intlExtension, ScriptContext * scriptContext, DynamicObject* intlObject) ->void
        {
            intlExtension->InjectIntlLibraryCode(scriptContext, intlObject, IntlInitializationType::Intl);
        };
        IntlObject->GetLibrary()->InitializeIntlForPrototypes(intlInitializer);

        return true;
    }